

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeymapper.cpp
# Opt level: O2

void * __thiscall QKeyMapper::resolveInterface(QKeyMapper *this,char *name,int revision)

{
  int iVar1;
  long lVar2;
  QDebug *this_00;
  void *pvVar3;
  long in_FS_OFFSET;
  QDebug QStack_48;
  char local_40 [24];
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = QtPrivateLogging::lcNativeInterface();
  if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
    local_28 = *(undefined8 *)(lVar2 + 8);
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    QMessageLogger::debug
              (local_40,"Comparing requested interface name %s with available %s",name,
               "QEvdevKeyMapper");
  }
  iVar1 = qstrcmp(name,"QEvdevKeyMapper");
  lVar2 = QtPrivateLogging::lcNativeInterface();
  if (iVar1 == 0) {
    if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
      local_28 = *(undefined8 *)(lVar2 + 8);
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      QMessageLogger::debug
                (local_40,
                 "Match for interface %s. Comparing revisions (requested %d / available %d)",name,
                 (ulong)(uint)revision,1);
    }
    lVar2 = QtPrivateLogging::lcNativeInterface();
    if (revision == 1) {
      if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
        local_28 = *(undefined8 *)(lVar2 + 8);
        local_40[0] = '\x02';
        local_40[1] = '\0';
        local_40[2] = '\0';
        local_40[3] = '\0';
        local_40[4] = '\0';
        local_40[5] = '\0';
        local_40[6] = '\0';
        local_40[7] = '\0';
        local_40[8] = '\0';
        local_40[9] = '\0';
        local_40[10] = '\0';
        local_40[0xb] = '\0';
        local_40[0xc] = '\0';
        local_40[0xd] = '\0';
        local_40[0xe] = '\0';
        local_40[0xf] = '\0';
        local_40[0x10] = '\0';
        local_40[0x11] = '\0';
        local_40[0x12] = '\0';
        local_40[0x13] = '\0';
        local_40[0x14] = '\0';
        local_40[0x15] = '\0';
        local_40[0x16] = '\0';
        local_40[0x17] = '\0';
        QMessageLogger::debug();
        this_00 = QDebug::operator<<(&QStack_48,"Full match. Returning dynamic cast of");
        QDebug::operator<<(this_00,QGuiApplicationPrivate::platform_integration);
        QDebug::~QDebug(&QStack_48);
      }
      if (QGuiApplicationPrivate::platform_integration != (QPlatformIntegration *)0x0) {
        pvVar3 = (void *)__dynamic_cast(QGuiApplicationPrivate::platform_integration,
                                        &QPlatformIntegration::typeinfo,
                                        &QNativeInterface::Private::QEvdevKeyMapper::typeinfo,
                                        0xfffffffffffffffe);
        goto LAB_002c4702;
      }
    }
    else if ((*(byte *)(lVar2 + 0x11) & 1) != 0) {
      local_28 = *(undefined8 *)(lVar2 + 8);
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      pvVar3 = (void *)0x0;
      QMessageLogger::warning
                (local_40,
                 "Native interface revision mismatch (requested %d / available %d) for interface %s"
                 ,(ulong)(uint)revision,1,name);
      goto LAB_002c4702;
    }
  }
  else if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
    local_28 = *(undefined8 *)(lVar2 + 8);
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    pvVar3 = (void *)0x0;
    QMessageLogger::debug(local_40,"No match for requested interface name %s",name);
    goto LAB_002c4702;
  }
  pvVar3 = (void *)0x0;
LAB_002c4702:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

void *QKeyMapper::resolveInterface(const char *name, int revision) const
{
    Q_UNUSED(name); Q_UNUSED(revision);
    using namespace QNativeInterface::Private;

#if QT_CONFIG(evdev)
    QT_NATIVE_INTERFACE_RETURN_IF(QEvdevKeyMapper, QGuiApplicationPrivate::platformIntegration());
#endif

#if QT_CONFIG(vxworksevdev)
    QT_NATIVE_INTERFACE_RETURN_IF(QVxKeyMapper, QGuiApplicationPrivate::platformIntegration());
#endif

    return nullptr;
}